

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

string * __thiscall TypeInfo::get_summary_abi_cxx11_(TypeInfo *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  char buffer [1024];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>
  *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
  *__range1_1;
  int types_with_method_count;
  int types_with_info;
  int total_types;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>
  *kv;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
  *__range1;
  int syms_with_type_info;
  int total_symbols;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_false,_true>
  *in_stack_fffffffffffffb50;
  allocator local_469;
  char local_468 [1024];
  reference local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_true>
  local_58 [2];
  int local_44;
  int local_40;
  int local_3c;
  reference local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_true>
  local_28;
  long local_20;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  local_20 = in_RSI + 0x70;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
                *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
              *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    local_38 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_false,_true>
                            *)0x1dff55);
    local_14 = local_14 + 1;
    bVar1 = GoalSymbol::has_type_info(&local_38->second);
    if (bVar1) {
      local_18 = local_18 + 1;
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_false,_true>
    ::operator++(in_stack_fffffffffffffb50);
  }
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
                *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
              *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  while (bVar1 = std::__detail::operator!=(local_58,&local_60), bVar1) {
    local_68 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_false,_true>
                            *)0x1e002a);
    local_3c = local_3c + 1;
    bVar1 = GoalType::has_info(&local_68->second);
    if (bVar1) {
      local_40 = local_40 + 1;
    }
    bVar1 = GoalType::has_method_count(&local_68->second);
    if (bVar1) {
      local_44 = local_44 + 1;
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_false,_true>
                  *)in_stack_fffffffffffffb50);
  }
  sprintf(local_468,
          "TypeInfo Summary\n Total Symbols: %d\n   with type info: %d (%.2f%%)\n Total Types: %d\n   with info: %d (%.2f%%)\n   with method count: %d (%.2f%%)\n"
          ,(double)(((float)local_18 * 100.0) / (float)local_14),
          (double)(((float)local_40 * 100.0) / (float)local_3c),
          (double)(((float)local_44 * 100.0) / (float)local_3c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_468,&local_469);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  return in_RDI;
}

Assistant:

std::string TypeInfo::get_summary() {
  int total_symbols = 0;
  int syms_with_type_info = 0;
  for (const auto& kv : m_symbols) {
    total_symbols++;
    if (kv.second.has_type_info()) {
      syms_with_type_info++;
    }
  }

  int total_types = 0;
  int types_with_info = 0;
  int types_with_method_count = 0;
  for (const auto& kv : m_types) {
    total_types++;
    if (kv.second.has_info()) {
      types_with_info++;
    }
    if (kv.second.has_method_count()) {
      types_with_method_count++;
    }
  }

  char buffer[1024];
  sprintf(buffer,
          "TypeInfo Summary\n"
          " Total Symbols: %d\n"
          "   with type info: %d (%.2f%%)\n"
          " Total Types: %d\n"
          "   with info: %d (%.2f%%)\n"
          "   with method count: %d (%.2f%%)\n",
          total_symbols, syms_with_type_info, 100.f * float(syms_with_type_info) / float(total_symbols),
          total_types, types_with_info, 100.f * float(types_with_info) / float(total_types),
          types_with_method_count, 100.f * float(types_with_method_count) / float(total_types));

  return {buffer};
}